

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O3

int UpnpOpenHttpGet(char *url,void **handle,char **contentType,int *contentLength,int *httpStatus,
                   int timeout)

{
  int iVar1;
  
  iVar1 = http_OpenHttpConnection(url,handle,timeout);
  if (iVar1 == 0) {
    iVar1 = http_MakeHttpRequest
                      (UPNP_HTTPMETHOD_GET,url,*handle,(UpnpString *)0x0,(char *)0x0,0,timeout);
    if (iVar1 == 0) {
      iVar1 = http_EndHttpRequest(*handle,timeout);
      if (iVar1 == 0) {
        iVar1 = http_GetHttpResponse
                          (*handle,(UpnpString *)0x0,contentType,contentLength,httpStatus,timeout);
        return iVar1;
      }
    }
  }
  return iVar1;
}

Assistant:

int UpnpOpenHttpGet(const char *url,
	void **handle,
	char **contentType,
	int *contentLength,
	int *httpStatus,
	int timeout)
{
	int status = UpnpOpenHttpConnection(url, handle, timeout);
	if (status == UPNP_E_SUCCESS) {
		status = UpnpMakeHttpRequest(UPNP_HTTPMETHOD_GET,
			url,
			*handle,
			NULL,
			NULL,
			0,
			timeout);
	}
	if (status == UPNP_E_SUCCESS) {
		status = UpnpEndHttpRequest(*handle, timeout);
	}
	if (status == UPNP_E_SUCCESS) {
		status = UpnpGetHttpResponse(*handle,
			NULL,
			contentType,
			contentLength,
			httpStatus,
			timeout);
	}
	return status;
}